

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_status(lysp_yang_ctx *ctx,uint16_t *flags,lysp_ext_instance **exts)

{
  ulong uVar1;
  ushort uVar2;
  LY_ERR LVar3;
  int iVar4;
  char *format;
  ly_ctx *plVar5;
  char *pcVar6;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  ly_stmt local_4c;
  char *local_48;
  ulong local_40;
  char *local_38;
  
  if ((*flags & 0x1c) == 0) {
    LVar3 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&local_48,&local_38,&local_40);
    uVar1 = local_40;
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    if (local_40 == 10) {
      iVar4 = strncmp(local_48,"deprecated",10);
      if (iVar4 == 0) {
        uVar2 = 8;
        goto LAB_0017290d;
      }
    }
    else if (local_40 == 8) {
      iVar4 = strncmp(local_48,"obsolete",8);
      if (iVar4 == 0) {
        uVar2 = 0x10;
        goto LAB_0017290d;
      }
    }
    else if ((local_40 == 7) && (iVar4 = strncmp(local_48,"current",7), iVar4 == 0)) {
      uVar2 = 4;
LAB_0017290d:
      *flags = *flags | uVar2;
      free(local_38);
      LVar3 = get_keyword(ctx,&local_4c,&local_48,&local_40);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      if (local_4c == LY_STMT_SYNTAX_SEMICOLON) {
        return LY_SUCCESS;
      }
      if (local_4c == LY_STMT_SYNTAX_LEFT_BRACE) {
        LVar3 = get_keyword(ctx,&local_4c,&local_48,&local_40);
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        if (local_4c == LY_STMT_SYNTAX_RIGHT_BRACE) {
          return LY_SUCCESS;
        }
        do {
          if (local_4c != LY_STMT_EXTENSION_INSTANCE) {
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar5 = (ly_ctx *)0x0;
            }
            else {
              plVar5 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar6 = lyplg_ext_stmt2str(local_4c);
            ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar6,"status");
            return LY_EVALID;
          }
          LVar3 = parse_ext(ctx,local_48,local_40,flags,LY_STMT_STATUS,0,exts);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          LVar3 = get_keyword(ctx,&local_4c,&local_48,&local_40);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
        } while (local_4c != LY_STMT_SYNTAX_RIGHT_BRACE);
        return LY_SUCCESS;
      }
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar5 = (ly_ctx *)0x0;
      }
      else {
        plVar5 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar6 = lyplg_ext_stmt2str(local_4c);
      format = "Invalid keyword \"%s\", expected \";\" or \"{\".";
      goto LAB_00172821;
    }
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
            uVar1 & 0xffffffff,local_48,"status");
    free(local_38);
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Duplicate keyword \"%s\".";
    pcVar6 = "status";
LAB_00172821:
    ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6);
  }
  return LY_EVALID;
}

Assistant:

static LY_ERR
parse_status(struct lysp_yang_ctx *ctx, uint16_t *flags, struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;

    if (*flags & LYS_STATUS_MASK) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "status");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));

    if ((word_len == ly_strlen_const("current")) && !strncmp(word, "current", word_len)) {
        *flags |= LYS_STATUS_CURR;
    } else if ((word_len == ly_strlen_const("deprecated")) && !strncmp(word, "deprecated", word_len)) {
        *flags |= LYS_STATUS_DEPRC;
    } else if ((word_len == ly_strlen_const("obsolete")) && !strncmp(word, "obsolete", word_len)) {
        *flags |= LYS_STATUS_OBSLT;
    } else {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "status");
        free(buf);
        return LY_EVALID;
    }
    free(buf);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, flags, LY_STMT_STATUS, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "status");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    return ret;
}